

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readme-test.cc
# Opt level: O0

void scope_example2::Execute(void)

{
  thread worker;
  MyLogger capture_messages;
  function<void_()> *in_stack_fffffffffffffee0;
  Logger *this;
  Logger *this_00;
  function<void_()> *in_stack_ffffffffffffff08;
  thread *in_stack_ffffffffffffff10;
  undefined1 local_70 [112];
  
  this_00 = (Logger *)(local_70 + 0x50);
  f();
  std::function<void_()>::operator()(in_stack_fffffffffffffee0);
  std::function<void_()>::~function((function<void_()> *)0x1089e2);
  g();
  std::function<void_()>::operator()(in_stack_fffffffffffffee0);
  std::function<void_()>::~function((function<void_()> *)0x108a0d);
  this = (Logger *)local_70;
  h();
  std::function<void_()>::operator()((function<void_()> *)this);
  std::function<void_()>::~function((function<void_()> *)0x108a38);
  Logger::Logger(this_00);
  g();
  std::thread::thread<std::function<void()>,,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::function<void_()>::~function((function<void_()> *)0x108a69);
  std::thread::join();
  std::thread::~thread((thread *)0x108a7f);
  Logger::~Logger(this);
  return;
}

Assistant:

void Execute() {
  f()();  // Fine.
  g()();  // Fine.
  h()();  // SIGSEGV!

  // Fine. g captures capture_messages, but capture_messages doesn't go out of
  // scope until the worker thread is joined.
  MyLogger capture_messages;
  std::thread worker(g());
  worker.join();
}